

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O2

void (anonymous_namespace)::ColorGradientRGB::alphaGrad<3u,4u>(uint32_t *pixBack,uint32_t pixFront)

{
  uint uVar1;
  byte bVar2;
  
  bVar2 = (byte)(pixFront >> 8);
  uVar1 = *pixBack;
  *pixBack = ((uVar1 >> 8 & 0xff) + (uint)bVar2 + (uint)bVar2 * 2 & 0x3fc) << 6 |
             ((uVar1 >> 0x10 & 0xff) + (pixFront >> 0x10 & 0xff) * 3 & 0x3fc) << 0xe |
             (uVar1 & 0xff) + (pixFront & 0xff) * 3 >> 2;
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront)
    {
        pixBack = gradientRGB<M, N>(pixFront, pixBack);
    }